

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

string * __thiscall
flatbuffers::java::JavaGenerator::ConvertPrimitiveTypeToObjectWrapper_ObjectAPI
          (string *__return_storage_ptr__,JavaGenerator *this,string *type_name)

{
  bool bVar1;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *type_name_local;
  JavaGenerator *this_local;
  
  local_20 = type_name;
  type_name_local = (string *)this;
  this_local = (JavaGenerator *)__return_storage_ptr__;
  bVar1 = std::operator==(type_name,"boolean");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Boolean",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    bVar1 = std::operator==(local_20,"byte");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Byte",local_35);
      std::allocator<char>::~allocator(local_35);
    }
    else {
      bVar1 = std::operator==(local_20,"char");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"Character",&local_36);
        std::allocator<char>::~allocator(&local_36);
      }
      else {
        bVar1 = std::operator==(local_20,"short");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"Short",&local_37);
          std::allocator<char>::~allocator(&local_37);
        }
        else {
          bVar1 = std::operator==(local_20,"int");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"Integer",&local_38);
            std::allocator<char>::~allocator(&local_38);
          }
          else {
            bVar1 = std::operator==(local_20,"long");
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"Long",&local_39);
              std::allocator<char>::~allocator(&local_39);
            }
            else {
              bVar1 = std::operator==(local_20,"float");
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,"Float",&local_3a);
                std::allocator<char>::~allocator(&local_3a);
              }
              else {
                bVar1 = std::operator==(local_20,"double");
                if (bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,"Double",&local_3b);
                  std::allocator<char>::~allocator(&local_3b);
                }
                else {
                  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertPrimitiveTypeToObjectWrapper_ObjectAPI(
      const std::string &type_name) const {
    if (type_name == "boolean")
      return "Boolean";
    else if (type_name == "byte")
      return "Byte";
    else if (type_name == "char")
      return "Character";
    else if (type_name == "short")
      return "Short";
    else if (type_name == "int")
      return "Integer";
    else if (type_name == "long")
      return "Long";
    else if (type_name == "float")
      return "Float";
    else if (type_name == "double")
      return "Double";
    return type_name;
  }